

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O1

ssize_t __thiscall HPack::BitOStream::write(BitOStream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  ssize_t extraout_RAX;
  byte bitLength;
  uint uVar3;
  long in_FS_OFFSET;
  uchar local_2a;
  byte local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bitLength = 8 - ((byte)this->bitsSet & 7);
  uVar2 = ~(-1 << (bitLength & 0x1f));
  uVar3 = __fd - uVar2;
  if ((uint)__fd < uVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      writeBits(this,(uchar)__fd,bitLength);
      return extraout_RAX;
    }
  }
  else {
    writeBits(this,(uchar)uVar2,bitLength);
    if (0x7f < uVar3) {
      uVar2 = uVar3;
      do {
        local_29 = (byte)uVar2 | 0x80;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (this->buffer,&local_29);
        this->bitsSet = this->bitsSet + 8;
        uVar3 = uVar2 >> 7;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar3;
      } while (bVar1);
    }
    local_2a = (uchar)uVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this->buffer,&local_2a);
    this->bitsSet = this->bitsSet + 8;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void BitOStream::write(quint32 src)
{
    const quint8 prefixLen = 8 - bitsSet % 8;
    const quint32 fullPrefix = (1 << prefixLen) - 1;

    // https://http2.github.io/http2-spec/compression.html#low-level.representation,
    // 5.1
    if (src < fullPrefix) {
        writeBits(uchar(src), prefixLen);
    } else {
        writeBits(uchar(fullPrefix), prefixLen);
        // We're on the byte boundary now,
        // so we can just 'push_back'.
        Q_ASSERT(!(bitsSet % 8));
        src -= fullPrefix;
        while (src >= 128) {
            buffer.push_back(uchar(src % 128 + 128));
            src /= 128;
            bitsSet += 8;
        }
        buffer.push_back(src);
        bitsSet += 8;
    }
}